

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlType xVar2;
  xmlParserInputState xVar3;
  xmlParserInputPtr pxVar4;
  int iVar5;
  xmlChar *pxVar6;
  ulong uVar7;
  
  xVar2 = ctxt->mlType;
  if ((((((xVar2 == XML_TYPE_XML) && (pxVar6 = ctxt->input->cur, *pxVar6 == '<')) &&
        (pxVar6[1] == '?')) && ((pxVar6[2] == 'x' && (pxVar6[3] == 'm')))) && (pxVar6[4] == 'l')) ||
     (((xVar2 == XML_TYPE_SML && (pxVar6 = ctxt->input->cur, *pxVar6 == '?')) &&
      ((pxVar6[1] == 'x' && ((pxVar6[2] == 'm' && (pxVar6[3] == 'l')))))))) {
    pxVar4 = ctxt->input;
    uVar7 = (ulong)pxVar4->cur[5];
    if ((uVar7 < 0x21) && ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0)) {
      pxVar6 = pxVar4->cur + (ulong)(xVar2 == XML_TYPE_XML) + 4;
      pxVar4->cur = pxVar6;
      pxVar4->col = pxVar4->col + (uint)(xVar2 == XML_TYPE_XML) + 4;
      if (*pxVar6 == '\0') {
        xmlParserInputGrow(pxVar4,0xfa);
      }
      xVar3 = ctxt->instate;
      ctxt->instate = XML_PARSER_START;
      iVar5 = xmlSkipBlankChars(ctxt);
      if (iVar5 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
      }
      pxVar6 = xmlParseVersionInfo(ctxt);
      if (pxVar6 == (xmlChar *)0x0) {
        pxVar6 = xmlCharStrdup("1.0");
      }
      else {
        iVar5 = xmlSkipBlankChars(ctxt);
        if (iVar5 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
        }
      }
      ctxt->input->version = pxVar6;
      pxVar6 = xmlParseEncodingDecl(ctxt);
      if (ctxt->errNo != 0x20) {
        if (ctxt->errNo == 0 && pxVar6 == (xmlChar *)0x0) {
          xmlFatalErrMsg(ctxt,XML_ERR_MISSING_ENCODING,"Missing encoding in text declaration\n");
        }
        xmlSkipBlankChars(ctxt);
        xVar2 = ctxt->mlType;
        if ((((xVar2 == XML_TYPE_XML) && (pxVar6 = ctxt->input->cur, *pxVar6 == '?')) &&
            (pxVar6[1] == '>')) ||
           ((xVar2 == XML_TYPE_SML && ((xVar1 = *ctxt->input->cur, xVar1 == ';' || (xVar1 == '\n')))
            ))) {
          pxVar4 = ctxt->input;
          pxVar6 = pxVar4->cur;
          pxVar4->cur = pxVar6 + 2;
          pxVar4->col = pxVar4->col + 2;
          if (pxVar6[2] == '\0') {
            xmlParserInputGrow(pxVar4,0xfa);
          }
        }
        else {
          if (((xVar2 == XML_TYPE_XML) && (*ctxt->input->cur == '>')) ||
             ((xVar2 == XML_TYPE_SML &&
              ((xVar1 = *ctxt->input->cur, xVar1 == ';' || (xVar1 == '\n')))))) {
            xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
            pxVar4 = ctxt->input;
            pxVar6 = pxVar4->cur;
            while( true ) {
              if ((*pxVar6 == '\0') || (*pxVar6 == '>')) break;
              pxVar4->cur = pxVar6 + 1;
              pxVar6 = pxVar6 + 1;
            }
          }
          xmlNextChar(ctxt);
        }
      }
      ctxt->instate = xVar3;
      return;
    }
  }
  xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;
    const xmlChar *encoding;
    int oldstate;

    DEBUG_ENTER(("xmlParseTextDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP_MLI(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	RETURN();
    }

    /* Avoid expansion of parameter entities when skipping blanks. */
    oldstate = ctxt->instate;
    ctxt->instate = XML_PARSER_START;

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL)
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
    else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    encoding = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        ctxt->instate = oldstate;
        RETURN();
    }
    if ((encoding == NULL) && (ctxt->errNo == XML_ERR_OK)) {
	xmlFatalErrMsg(ctxt, XML_ERR_MISSING_ENCODING,
		       "Missing encoding in text declaration\n");
    }

    SKIP_BLANKS;
    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
        SKIP(2);
    } else if (RAW_IS_GT_MLI) { /* RAW == '>' */
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	MOVETO_ENDTAG(CUR_PTR);
	NEXT;
    }

    ctxt->instate = oldstate;
    RETURN();
}